

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

size_t OpenMD::DataStorage::getBytesPerStuntDouble(int layout)

{
  size_t bytes;
  int layout_local;
  
  bytes = 0;
  if ((layout & 1U) != 0) {
    bytes = 0x18;
  }
  if ((layout & 2U) != 0) {
    bytes = bytes + 0x18;
  }
  if ((layout & 4U) != 0) {
    bytes = bytes + 0x18;
  }
  if ((layout & 8U) != 0) {
    bytes = bytes + 0x48;
  }
  if ((layout & 0x10U) != 0) {
    bytes = bytes + 0x18;
  }
  if ((layout & 0x20U) != 0) {
    bytes = bytes + 0x18;
  }
  if ((layout & 0x40U) != 0) {
    bytes = bytes + 8;
  }
  if ((layout & 0x80U) != 0) {
    bytes = bytes + 8;
  }
  if ((layout & 0x100U) != 0) {
    bytes = bytes + 8;
  }
  if ((layout & 0x200U) != 0) {
    bytes = bytes + 8;
  }
  if ((layout & 0x400U) != 0) {
    bytes = bytes + 0x18;
  }
  if ((layout & 0x800U) != 0) {
    bytes = bytes + 0x48;
  }
  if ((layout & 0x1000U) != 0) {
    bytes = bytes + 0x18;
  }
  if ((layout & 0x2000U) != 0) {
    bytes = bytes + 8;
  }
  if ((layout & 0x4000U) != 0) {
    bytes = bytes + 8;
  }
  if ((layout & 0x8000U) != 0) {
    bytes = bytes + 8;
  }
  if ((layout & 0x10000U) != 0) {
    bytes = bytes + 8;
  }
  if ((layout & 0x20000U) != 0) {
    bytes = bytes + 8;
  }
  return bytes;
}

Assistant:

std::size_t DataStorage::getBytesPerStuntDouble(int layout) {
    std::size_t bytes = 0;
    if (layout & dslPosition) { bytes += sizeof(Vector3d); }
    if (layout & dslVelocity) { bytes += sizeof(Vector3d); }
    if (layout & dslForce) { bytes += sizeof(Vector3d); }
    if (layout & dslAmat) { bytes += sizeof(RotMat3x3d); }
    if (layout & dslAngularMomentum) { bytes += sizeof(Vector3d); }
    if (layout & dslTorque) { bytes += sizeof(Vector3d); }
    if (layout & dslParticlePot) { bytes += sizeof(RealType); }
    if (layout & dslDensity) { bytes += sizeof(RealType); }
    if (layout & dslFunctional) { bytes += sizeof(RealType); }
    if (layout & dslFunctionalDerivative) { bytes += sizeof(RealType); }
    if (layout & dslDipole) { bytes += sizeof(Vector3d); }
    if (layout & dslQuadrupole) { bytes += sizeof(Mat3x3d); }
    if (layout & dslElectricField) { bytes += sizeof(Vector3d); }
    if (layout & dslSkippedCharge) { bytes += sizeof(RealType); }
    if (layout & dslFlucQPosition) { bytes += sizeof(RealType); }
    if (layout & dslFlucQVelocity) { bytes += sizeof(RealType); }
    if (layout & dslFlucQForce) { bytes += sizeof(RealType); }
    if (layout & dslSitePotential) { bytes += sizeof(RealType); }

    return bytes;
  }